

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int __thiscall
opengv::relative_pose::modules::Eigensolver_step::operator()
          (Eigensolver_step *this,VectorXd *x,VectorXd *fvec)

{
  double *pdVar1;
  Matrix<double,_1,_3,_1,_1,_3> jacobian;
  cayley_t cayley;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&cayley,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
  eigensolver::getSmallestEVwithJacobian
            (this->_xxF,this->_yyF,this->_zzF,this->_xyF,this->_yzF,this->_zxF,&cayley,&jacobian);
  pdVar1 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  *pdVar1 = jacobian.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[0];
  pdVar1[1] = jacobian.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
              .array[1];
  pdVar1[2] = jacobian.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
              .array[2];
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
  {
    cayley_t cayley = x;
    Eigen::Matrix<double,1,3> jacobian;
    eigensolver::getSmallestEVwithJacobian(
        _xxF,_yyF,_zzF,_xyF,_yzF,_zxF,cayley,jacobian);

    fvec[0] = jacobian(0,0);
    fvec[1] = jacobian(0,1);
    fvec[2] = jacobian(0,2);
    return 0;
  }